

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_swrenderer.cpp
# Opt level: O0

void __thiscall
FSoftwareRenderer::Precache
          (FSoftwareRenderer *this,BYTE *texhitlist,
          TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *actorhitlist)

{
  long lVar1;
  undefined8 __s;
  bool bVar2;
  uint uVar3;
  int iVar4;
  spritedef_t *psVar5;
  FTexture *tex;
  int local_6c;
  int i_2;
  int cnt;
  FTextureID pic;
  spriteframe_t *frame;
  int k;
  int j;
  int i_1;
  int i;
  PClassActor *cls;
  Pair *pair;
  Iterator it;
  BYTE *spritelist;
  TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *actorhitlist_local;
  BYTE *texhitlist_local;
  FSoftwareRenderer *this_local;
  
  uVar3 = TArray<spritedef_t,_spritedef_t>::Size(&sprites);
  it._8_8_ = operator_new__((ulong)uVar3);
  TMapIterator<PClassActor_*,_bool,_TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_>_>
  ::TMapIterator((TMapIterator<PClassActor_*,_bool,_TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_>_>
                  *)&pair,actorhitlist);
  __s = it._8_8_;
  uVar3 = TArray<spritedef_t,_spritedef_t>::Size(&sprites);
  memset((void *)__s,0,(ulong)uVar3);
  while (bVar2 = TMapIterator<PClassActor_*,_bool,_TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_>_>
                 ::NextPair((TMapIterator<PClassActor_*,_bool,_TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_>_>
                             *)&pair,(Pair **)&cls), bVar2) {
    lVar1 = *(long *)&(cls->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                      super_PCompoundType.super_PType.super_PTypeBase;
    for (j = 0; j < *(int *)(lVar1 + 0x128); j = j + 1) {
      *(undefined1 *)(it._8_8_ + (long)*(int *)(*(long *)(lVar1 + 0x110) + (long)j * 0x28 + 0x10)) =
           1;
    }
  }
  k = TArray<spritedef_t,_spritedef_t>::Size(&sprites);
  while (k = k - 1, -1 < k) {
    if (*(char *)(it._8_8_ + (long)k) != '\0') {
      for (frame._4_4_ = 0; psVar5 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)k),
          frame._4_4_ < (int)(uint)psVar5->numframes; frame._4_4_ = frame._4_4_ + 1) {
        psVar5 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)k);
        _cnt = TArray<spriteframe_t,_spriteframe_t>::operator[]
                         (&SpriteFrames,(long)(int)((uint)psVar5->spriteframes + frame._4_4_));
        for (frame._0_4_ = 0; (int)frame < 0x10; frame._0_4_ = (int)frame + 1) {
          i_2 = _cnt->Texture[(int)frame].texnum;
          bVar2 = FTextureID::isValid((FTextureID *)&i_2);
          if (bVar2) {
            iVar4 = FTextureID::GetIndex((FTextureID *)&i_2);
            texhitlist[iVar4] = '\b';
          }
        }
      }
    }
  }
  if (it._8_8_ != 0) {
    operator_delete__((void *)it._8_8_);
  }
  local_6c = FTextureManager::NumTextures(&TexMan);
  while (local_6c = local_6c + -1, -1 < local_6c) {
    tex = FTextureManager::ByIndex(&TexMan,local_6c);
    PrecacheTexture(this,tex,(uint)texhitlist[local_6c]);
  }
  return;
}

Assistant:

void FSoftwareRenderer::Precache(BYTE *texhitlist, TMap<PClassActor*, bool> &actorhitlist)
{
	BYTE *spritelist = new BYTE[sprites.Size()];
	TMap<PClassActor*, bool>::Iterator it(actorhitlist);
	TMap<PClassActor*, bool>::Pair *pair;

	memset(spritelist, 0, sprites.Size());

	while (it.NextPair(pair))
	{
		PClassActor *cls = pair->Key;

		for (int i = 0; i < cls->NumOwnedStates; i++)
		{
			spritelist[cls->OwnedStates[i].sprite] = true;
		}
	}

	// Precache textures (and sprites).

	for (int i = (int)(sprites.Size() - 1); i >= 0; i--)
	{
		if (spritelist[i])
		{
			int j, k;
			for (j = 0; j < sprites[i].numframes; j++)
			{
				const spriteframe_t *frame = &SpriteFrames[sprites[i].spriteframes + j];

				for (k = 0; k < 16; k++)
				{
					FTextureID pic = frame->Texture[k];
					if (pic.isValid())
					{
						texhitlist[pic.GetIndex()] = FTextureManager::HIT_Sprite;
					}
				}
			}
		}
	}
	delete[] spritelist;

	int cnt = TexMan.NumTextures();
	for (int i = cnt - 1; i >= 0; i--)
	{
		PrecacheTexture(TexMan.ByIndex(i), texhitlist[i]);
	}
}